

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

NULLCRef * NULLCVector::VectorIndex(NULLCRef *__return_storage_ptr__,vector *vec,uint index)

{
  char *local_38;
  uint local_2c;
  uint index_local;
  vector *vec_local;
  
  memset(__return_storage_ptr__,0,0xc);
  if (index < vec->size) {
    if (vec->flags == 0) {
      local_2c = vec->elemType;
    }
    else {
      local_2c = nullcGetSubType(vec->elemType);
    }
    __return_storage_ptr__->typeID = local_2c;
    if (vec->flags == 0) {
      local_38 = (vec->data).ptr + vec->elemSize * index;
    }
    else {
      local_38 = *(char **)((vec->data).ptr + (ulong)index * 8);
    }
    __return_storage_ptr__->ptr = local_38;
  }
  else {
    nullcThrowError("operator[] array index out of bounds");
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorIndex(vector* vec, unsigned int index)
	{
		NULLCRef ret = { 0, 0 };
		if(index >= vec->size)
		{
			nullcThrowError("operator[] array index out of bounds");
			return ret;
		}
		ret.typeID = (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType);
		ret.ptr = vec->flags ? ((char**)vec->data.ptr)[index] : (vec->data.ptr + vec->elemSize * index);
		return ret;
	}